

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O2

int zmq::poll(pollfd *__fds,nfds_t __nfds,int __timeout)

{
  int iVar1;
  error_t *this;
  undefined4 in_register_00000014;
  
  iVar1 = zmq_poll(__fds,__nfds,CONCAT44(in_register_00000014,__timeout));
  if (-1 < iVar1) {
    return iVar1;
  }
  this = (error_t *)__cxa_allocate_exception(0x10);
  error_t::error_t(this);
  __cxa_throw(this,&error_t::typeinfo,std::exception::~exception);
}

Assistant:

inline int poll(zmq_pollitem_t *items_, size_t nitems_, long timeout_ = -1)
{
    int rc = zmq_poll(items_, static_cast<int>(nitems_), timeout_);
    if (rc < 0)
        throw error_t();
    return rc;
}